

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

Cba_Man_t * Prs_ManBuildCbaVerilog(char *pFileName,Vec_Ptr_t *vDes)

{
  Vec_Int_t *pVVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  Hash_IntMan_t *pHVar7;
  Prs_Ntk_t *pNtk;
  uint uVar8;
  Abc_Nam_t *pAVar9;
  Abc_Nam_t *pAVar10;
  Abc_Nam_t *pAVar11;
  Cba_Man_t *pCVar12;
  char *pcVar13;
  size_t sVar14;
  void **ppvVar15;
  Cba_Ntk_t *pCVar16;
  int *piVar17;
  long lVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  int local_44;
  long local_40;
  Prs_Ntk_t *local_38;
  
  pvVar6 = *vDes->pArray;
  pAVar9 = Abc_NamRef(*(Abc_Nam_t **)((long)pvVar6 + 8));
  pAVar10 = Abc_NamRef(*(Abc_Nam_t **)((long)pvVar6 + 0x10));
  pAVar11 = Abc_NamStart(100,0x18);
  uVar8 = vDes->nSize;
  pHVar7 = *(Hash_IntMan_t **)((long)pvVar6 + 0x18);
  piVar17 = &pHVar7->nRefs;
  *piVar17 = *piVar17 + 1;
  pCVar12 = (Cba_Man_t *)calloc(1,0x658);
  pcVar13 = Extra_FileDesignName(pFileName);
  pCVar12->pName = pcVar13;
  if (pFileName == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pFileName);
    pcVar13 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar13,pFileName);
  }
  pCVar12->pSpec = pcVar13;
  if (pAVar9 == (Abc_Nam_t *)0x0) {
    pAVar9 = Abc_NamStart(1000,0x18);
  }
  pCVar12->pStrs = pAVar9;
  pAVar9 = pAVar10;
  if (pAVar10 == (Abc_Nam_t *)0x0) {
    pAVar9 = Abc_NamStart(100,0x18);
  }
  pCVar12->pFuns = pAVar9;
  if (pAVar11 == (Abc_Nam_t *)0x0) {
    pAVar11 = Abc_NamStart(100,0x18);
  }
  pCVar12->pMods = pAVar11;
  pCVar12->vHash = pHVar7;
  if (pAVar10 == (Abc_Nam_t *)0x0) {
    Abc_NamStrFindOrAdd(pAVar9,"1\'b0",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar9,"1\'b1",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar9,"1\'bx",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar9,"1\'bz",(int *)0x0);
  }
  if ((int)uVar8 < 0) {
    ppvVar15 = (void **)malloc(0x80);
    iVar20 = 0x10;
  }
  else {
    iVar20 = uVar8 + 1;
    ppvVar15 = (void **)malloc((ulong)uVar8 * 8 + 8);
  }
  (pCVar12->vNtks).pArray = ppvVar15;
  (pCVar12->vNtks).nCap = iVar20;
  (pCVar12->vNtks).nSize = 1;
  *ppvVar15 = (void *)0x0;
  pCVar12->iRoot = 1;
  if (0 < vDes->nSize) {
    lVar18 = 0;
    do {
      local_38 = (Prs_Ntk_t *)vDes->pArray[lVar18];
      iVar20 = local_38->iModuleName;
      uVar8 = (local_38->vInputs).nSize;
      uVar3 = (local_38->vOutputs).nSize;
      lVar22 = (long)(int)(uVar3 + uVar8 + (local_38->vInouts).nSize) +
               (long)(local_38->vObjs).nSize;
      local_40 = lVar18;
      pCVar16 = (Cba_Ntk_t *)calloc(1,0x1b0);
      uVar21 = (uint)lVar22;
      if ((int)(uVar3 | uVar8 | uVar21) < 0) {
        __assert_fail("nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                      ,0x1a5,"Cba_Ntk_t *Cba_NtkAlloc(Cba_Man_t *, int, int, int, int, int, int)");
      }
      uVar4 = (pCVar12->vNtks).nSize;
      pCVar16->Id = uVar4;
      if (uVar4 == (pCVar12->vNtks).nCap) {
        if ((int)uVar4 < 0x10) {
          ppvVar15 = (pCVar12->vNtks).pArray;
          if (ppvVar15 == (void **)0x0) {
            ppvVar15 = (void **)malloc(0x80);
          }
          else {
            ppvVar15 = (void **)realloc(ppvVar15,0x80);
          }
          (pCVar12->vNtks).pArray = ppvVar15;
          (pCVar12->vNtks).nCap = 0x10;
        }
        else {
          ppvVar15 = (pCVar12->vNtks).pArray;
          if (ppvVar15 == (void **)0x0) {
            ppvVar15 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar15 = (void **)realloc(ppvVar15,(ulong)uVar4 << 4);
          }
          (pCVar12->vNtks).pArray = ppvVar15;
          (pCVar12->vNtks).nCap = uVar4 * 2;
        }
      }
      else {
        ppvVar15 = (pCVar12->vNtks).pArray;
      }
      iVar5 = (pCVar12->vNtks).nSize;
      (pCVar12->vNtks).nSize = iVar5 + 1;
      ppvVar15[iVar5] = pCVar16;
      pCVar16->NameId = iVar20;
      pCVar16->pDesign = pCVar12;
      if ((pCVar16->vInputs).nCap < (int)uVar8) {
        piVar17 = (pCVar16->vInputs).pArray;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)malloc((long)(int)uVar8 << 2);
        }
        else {
          piVar17 = (int *)realloc(piVar17,(long)(int)uVar8 << 2);
        }
        (pCVar16->vInputs).pArray = piVar17;
        if (piVar17 == (int *)0x0) goto LAB_003ee12e;
        (pCVar16->vInputs).nCap = uVar8;
      }
      if ((pCVar16->vOutputs).nCap < (int)uVar3) {
        piVar17 = (pCVar16->vOutputs).pArray;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)malloc((long)(int)uVar3 << 2);
        }
        else {
          piVar17 = (int *)realloc(piVar17,(long)(int)uVar3 << 2);
        }
        (pCVar16->vOutputs).pArray = piVar17;
        if (piVar17 == (int *)0x0) goto LAB_003ee12e;
        (pCVar16->vOutputs).nCap = uVar3;
      }
      uVar8 = (pCVar16->vObjType).nCap;
      uVar23 = (ulong)uVar8;
      if ((int)uVar8 <= (int)uVar21) {
        uVar23 = lVar22 + 1;
        pcVar13 = (pCVar16->vObjType).pArray;
        if (pcVar13 == (char *)0x0) {
          pcVar13 = (char *)malloc(uVar23);
        }
        else {
          pcVar13 = (char *)realloc(pcVar13,uVar23);
        }
        (pCVar16->vObjType).pArray = pcVar13;
        (pCVar16->vObjType).nCap = (int)uVar23;
      }
      iVar20 = (int)uVar23;
      if ((pCVar16->vObjType).nSize == iVar20) {
        if (iVar20 < 0x10) {
          pcVar13 = (pCVar16->vObjType).pArray;
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)malloc(0x10);
          }
          else {
            pcVar13 = (char *)realloc(pcVar13,0x10);
          }
          (pCVar16->vObjType).pArray = pcVar13;
          (pCVar16->vObjType).nCap = 0x10;
        }
        else {
          uVar8 = iVar20 * 2;
          pcVar13 = (pCVar16->vObjType).pArray;
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)malloc((ulong)uVar8);
          }
          else {
            pcVar13 = (char *)realloc(pcVar13,(ulong)uVar8);
          }
          (pCVar16->vObjType).pArray = pcVar13;
          (pCVar16->vObjType).nCap = uVar8;
        }
      }
      else {
        pcVar13 = (pCVar16->vObjType).pArray;
      }
      iVar20 = (pCVar16->vObjType).nSize;
      (pCVar16->vObjType).nSize = iVar20 + 1;
      pcVar13[iVar20] = '\0';
      pVVar1 = &pCVar16->vObjFin0;
      iVar20 = uVar21 + 2;
      if ((pCVar16->vObjFin0).nCap < iVar20) {
        piVar17 = (pCVar16->vObjFin0).pArray;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)malloc((long)iVar20 << 2);
        }
        else {
          piVar17 = (int *)realloc(piVar17,(long)iVar20 << 2);
        }
        (pCVar16->vObjFin0).pArray = piVar17;
        if (piVar17 == (int *)0x0) goto LAB_003ee12e;
        pVVar1->nCap = iVar20;
      }
      Vec_IntPush(pVVar1,0);
      Vec_IntPush(pVVar1,1);
      pVVar1 = &pCVar16->vObjFon0;
      if ((pCVar16->vObjFon0).nCap < iVar20) {
        piVar17 = (pCVar16->vObjFon0).pArray;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)malloc((long)iVar20 << 2);
        }
        else {
          piVar17 = (int *)realloc(piVar17,(long)iVar20 << 2);
        }
        (pCVar16->vObjFon0).pArray = piVar17;
        if (piVar17 == (int *)0x0) goto LAB_003ee12e;
        pVVar1->nCap = iVar20;
      }
      Vec_IntPush(pVVar1,0);
      Vec_IntPush(pVVar1,1);
      if ((pCVar16->vFinFon).nCap < 0x65) {
        piVar17 = (pCVar16->vFinFon).pArray;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)malloc(0x194);
        }
        else {
          piVar17 = (int *)realloc(piVar17,0x194);
        }
        (pCVar16->vFinFon).pArray = piVar17;
        if (piVar17 == (int *)0x0) goto LAB_003ee12e;
        (pCVar16->vFinFon).nCap = 0x65;
      }
      Vec_IntPush(&pCVar16->vFinFon,0);
      if ((pCVar16->vFonObj).nCap < 0x65) {
        piVar17 = (pCVar16->vFonObj).pArray;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)malloc(0x194);
        }
        else {
          piVar17 = (int *)realloc(piVar17,0x194);
        }
        (pCVar16->vFonObj).pArray = piVar17;
        if (piVar17 == (int *)0x0) {
LAB_003ee12e:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pCVar16->vFonObj).nCap = 0x65;
      }
      Vec_IntPush(&pCVar16->vFonObj,0);
      Prs_CreateVerilogPio(pCVar16,local_38);
      pAVar9 = pCVar12->pMods;
      pcVar13 = Abc_NamStr(pCVar16->pDesign->pStrs,pCVar16->NameId);
      iVar20 = Abc_NamStrFindOrAdd(pAVar9,pcVar13,&local_44);
      if (local_44 == 0) {
        if (iVar20 != pCVar16->Id) {
          __assert_fail("NtkId == pNtk->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                        ,0x1f7,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
        }
      }
      else {
        pcVar13 = Abc_NamStr(pCVar16->pDesign->pStrs,pCVar16->NameId);
        printf("Network with name \"%s\" already exists.\n",pcVar13);
      }
      lVar18 = local_40 + 1;
    } while (lVar18 < vDes->nSize);
    if (0 < vDes->nSize) {
      lVar18 = 0;
      do {
        pNtk = (Prs_Ntk_t *)vDes->pArray[lVar18];
        pcVar13 = Abc_NamStr(pNtk->pStrs,pNtk->iModuleName);
        printf("Building module \"%s\"...\n",pcVar13);
        lVar22 = lVar18 + 1;
        if (lVar22 < (pCVar12->vNtks).nSize) {
          pCVar16 = (Cba_Ntk_t *)(pCVar12->vNtks).pArray[lVar18 + 1];
        }
        else {
          pCVar16 = (Cba_Ntk_t *)0x0;
        }
        Prs_CreateVerilogNtk(pCVar16,pNtk);
        lVar18 = lVar22;
      } while (lVar22 < vDes->nSize);
    }
  }
  if (1 < (pCVar12->vNtks).nSize) {
    lVar18 = 1;
    do {
      pCVar16 = (Cba_Ntk_t *)(pCVar12->vNtks).pArray[lVar18];
      if ((pCVar16->vSeq).nSize != 0) {
        __assert_fail("Cba_NtkBoxSeqNum(p) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                      ,0x228,"void Cba_NtkPrepareSeq(Cba_Ntk_t *)");
      }
      iVar20 = Cba_NtkIsSeq(pCVar16);
      if ((iVar20 != 0) &&
         (uVar8 = (pCVar16->vObjType).nSize, uVar23 = (ulong)uVar8, 1 < (int)uVar8)) {
        lVar22 = 1;
        uVar19 = extraout_RDX;
        do {
          if ((int)uVar23 <= lVar22) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          bVar2 = (pCVar16->vObjType).pArray[lVar22];
          if (0xffffffa8 < bVar2 - 0x5a) {
            if (bVar2 == 3) {
              Vec_IntFillExtra(&pCVar16->vObjFunc,(int)lVar22 + 1,(int)uVar19);
              if ((pCVar16->vObjFunc).nSize <= lVar22) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar8 = *(uint *)((long)(pCVar16->pDesign->vNtks).pArray
                                      [(uint)(pCVar16->vObjFunc).pArray[lVar22]] + 0x14) >> 2 & 1;
              uVar19 = extraout_RDX_00;
            }
            else {
              uVar8 = (uint)(bVar2 - 0x4c < 0xc);
            }
            if (uVar8 != 0) {
              Vec_IntPush(&pCVar16->vSeq,(int)lVar22);
              uVar19 = extraout_RDX_01;
            }
          }
          lVar22 = lVar22 + 1;
          uVar23 = (ulong)(pCVar16->vObjType).nSize;
        } while (lVar22 < (long)uVar23);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pCVar12->vNtks).nSize);
  }
  return pCVar12;
}

Assistant:

Cba_Man_t * Prs_ManBuildCbaVerilog( char * pFileName, Vec_Ptr_t * vDes )
{
    Prs_Ntk_t * pPrsNtk; int i, fError = 0;
    Prs_Ntk_t * pPrsRoot = Prs_ManRoot(vDes);
    // start the manager
    Abc_Nam_t * pStrs = Abc_NamRef(pPrsRoot->pStrs);
    Abc_Nam_t * pFuns = Abc_NamRef(pPrsRoot->pFuns);
    Abc_Nam_t * pMods = Abc_NamStart( 100, 24 );
    Cba_Man_t * p = Cba_ManAlloc( pFileName, Vec_PtrSize(vDes), pStrs, pFuns, pMods, Hash_IntManRef(pPrsRoot->vHash) );
    // initialize networks
    Vec_PtrForEachEntry( Prs_Ntk_t *, vDes, pPrsNtk, i )
    {
        Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Prs_NtkId(pPrsNtk), Prs_NtkPiNum(pPrsNtk), Prs_NtkPoNum(pPrsNtk), Prs_NtkObjNum(pPrsNtk), 100, 100 );
        Prs_CreateVerilogPio( pNtk, pPrsNtk );
        Cba_NtkAdd( p, pNtk );
    }
    // create networks
    Vec_PtrForEachEntry( Prs_Ntk_t *, vDes, pPrsNtk, i )
    {
        printf( "Building module \"%s\"...\n", Prs_NtkName(pPrsNtk) );
        fError = Prs_CreateVerilogNtk( Cba_ManNtk(p, i+1), pPrsNtk );
        if ( fError )
            break;
    }
    if ( fError )
        printf( "Quitting because of errors.\n" );
    else
        Cba_ManPrepareSeq( p );
    return p;
}